

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcGraft.c
# Opt level: O2

void Sbc_ManDetectMultTest(Wlc_Ntk_t *pNtk,int fVerbose)

{
  uint uVar1;
  Gia_Man_t *pGia;
  Gia_Man_t *vIns;
  Vec_Int_t *vGia2Out;
  Gia_Man_t *p;
  
  pGia = Wlc_NtkBitBlast(pNtk,(Wlc_BstPar_t *)0x0);
  vIns = (Gia_Man_t *)Sdb_StoComputeCutsDetect(pGia);
  if ((vIns != (Gia_Man_t *)0x0) &&
     (uVar1 = *(int *)((long)&vIns->pName + 4), uVar1 != 0 && (uVar1 & 1) == 0)) {
    p = vIns;
    vGia2Out = Sbc_ManDetectMult(pGia,(Vec_Int_t *)vIns);
    Sbc_ManWlcNodes(pNtk,p,vGia2Out,*(int *)((long)&vIns->pName + 4));
    Vec_IntFree(vGia2Out);
    Vec_IntFree((Vec_Int_t *)vIns);
    Gia_ManStop(pGia);
    return;
  }
  puts("Input identification did not work out.");
  return;
}

Assistant:

void Sbc_ManDetectMultTest( Wlc_Ntk_t * pNtk, int fVerbose )
{
    extern Vec_Int_t * Sdb_StoComputeCutsDetect( Gia_Man_t * pGia );
    Gia_Man_t * p = Wlc_NtkBitBlast( pNtk, NULL );//, -1, 0, 0, 0, 0, 1, 0, 0 ); // <= no cleanup
    Vec_Int_t * vIns, * vGia2Out;
    int iObjFound = -1;
//    Gia_Obj_t * pObj; int i;
//    Gia_ManForEachCo( p, pObj, i )
//        printf( "Output %2d - driver %5d (%d)\n", i, Gia_ObjFaninId0p(p, pObj), Gia_ObjFaninC0(pObj) );

    vIns = Sdb_StoComputeCutsDetect( p );
    if ( vIns == NULL || Vec_IntSize(vIns) == 0 || (Vec_IntSize(vIns) % 2) != 0 )
    {
        printf( "Input identification did not work out.\n" );
        return;
    }

    vGia2Out = Sbc_ManDetectMult( p, vIns );

    iObjFound = Sbc_ManWlcNodes( pNtk, p, vGia2Out, Vec_IntSize(vIns) );

    Vec_IntFree( vGia2Out );
    Vec_IntFree( vIns );

    Gia_ManStop( p );
}